

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardPatternSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::WildcardPatternSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token dotStar;
  WildcardPatternSyntax *this_00;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (WildcardPatternSyntax *)allocate(this,0x20,8);
  dotStar.kind = args->kind;
  dotStar._2_1_ = args->field_0x2;
  dotStar.numFlags.raw = (args->numFlags).raw;
  dotStar.rawLen = args->rawLen;
  dotStar.info = args->info;
  slang::syntax::WildcardPatternSyntax::WildcardPatternSyntax(this_00,dotStar);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }